

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O0

double __thiscall lightconf::scanner::expect_number(scanner *this)

{
  token *tok;
  token *tok_00;
  token local_248;
  double local_208;
  double val;
  int local_1cc;
  token local_1c0;
  token local_180;
  string local_140;
  token local_110;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  token local_50;
  scanner *local_10;
  scanner *this_local;
  
  local_10 = this;
  skip_whitespace(this,false);
  cur_token(&local_50,this);
  token::~token(&local_50);
  if (local_50.type != number_token) {
    token::token(&local_110,number_token);
    token_name_abi_cxx11_(&local_d0,(lightconf *)&local_110,tok);
    std::operator+(&local_b0,"expected ",&local_d0);
    std::operator+(&local_90,&local_b0," but found ");
    cur_token(&local_180,this);
    token_name_abi_cxx11_(&local_140,(lightconf *)&local_180,tok_00);
    std::operator+(&local_70,&local_90,&local_140);
    cur_token(&local_1c0,this);
    cur_token((token *)&val,this);
    fail(this,&local_70,local_1c0.line,local_1cc);
    token::~token((token *)&val);
    token::~token(&local_1c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_140);
    token::~token(&local_180);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    token::~token(&local_110);
  }
  cur_token(&local_248,this);
  token::~token(&local_248);
  local_208 = local_248.number_value;
  next_token(this);
  return local_208;
}

Assistant:

inline double scanner::expect_number() {
    skip_whitespace(false);
    if (cur_token().type != token_type::number_token) {
        fail("expected " + token_name(token(token_type::number_token)) + " but found " + token_name(cur_token()),
            cur_token().line, cur_token().pos);
    }
    double val = cur_token().number_value;
    next_token();
    return val;
}